

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O3

void phosg::freadx(FILE *f,void *data,size_t size)

{
  int iVar1;
  size_t sVar2;
  io_error *piVar3;
  string sStack_48;
  
  sVar2 = ::fread(data,1,size,(FILE *)f);
  if ((long)sVar2 < 0) {
    piVar3 = (io_error *)__cxa_allocate_exception(0x20);
    iVar1 = fileno((FILE *)f);
    io_error::io_error(piVar3,iVar1);
    __cxa_throw(piVar3,&io_error::typeinfo,io_error::~io_error);
  }
  if (sVar2 == size) {
    return;
  }
  piVar3 = (io_error *)__cxa_allocate_exception(0x20);
  iVar1 = fileno((FILE *)f);
  string_printf_abi_cxx11_((string *)&sStack_48,"expected %zu bytes, read %zd bytes",size,sVar2);
  io_error::io_error(piVar3,iVar1,&sStack_48);
  __cxa_throw(piVar3,&io_error::typeinfo,io_error::~io_error);
}

Assistant:

void freadx(FILE* f, void* data, size_t size) {
  ssize_t ret_size = ::fread(data, 1, size, f);
  if (ret_size < 0) {
    throw io_error(fileno(f));
  } else if (ret_size != static_cast<ssize_t>(size)) {
    throw io_error(fileno(f), string_printf("expected %zu bytes, read %zd bytes", size, ret_size));
  }
}